

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.h
# Opt level: O2

char * google::protobuf::internal::FieldParser<google::protobuf::internal::UnknownFieldParserHelper>
                 (uint64_t tag,UnknownFieldParserHelper *field_parser,char *ptr,ParseContext *ctx)

{
  char *pcVar1;
  uint32_t num;
  uint64_t value;
  LogMessage local_28;
  
  num = (uint32_t)(tag >> 3);
  if (num == 0) {
    return (char *)0x0;
  }
  switch((uint)tag & 7) {
  case 0:
    pcVar1 = VarintParse<unsigned_long>(ptr,(unsigned_long *)&local_28);
    if (pcVar1 == (char *)0x0) {
      return (char *)0x0;
    }
    UnknownFieldParserHelper::AddVarint(field_parser,num,local_28._0_8_);
    return pcVar1;
  case 1:
    UnknownFieldParserHelper::AddFixed64(field_parser,num,*(uint64_t *)ptr);
    return ptr + 8;
  case 2:
    pcVar1 = UnknownFieldParserHelper::ParseLengthDelimited(field_parser,num,ptr,ctx);
    break;
  case 3:
    pcVar1 = UnknownFieldParserHelper::ParseGroup(field_parser,num,ptr,ctx);
    break;
  case 4:
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_28,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/parse_context.h"
               ,0x55a);
    absl::lts_20250127::log_internal::LogMessage::operator<<
              (&local_28,(char (*) [13])"Can\'t happen");
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_28);
  case 5:
    UnknownFieldParserHelper::AddFixed32(field_parser,num,*(uint32_t *)ptr);
    return ptr + 4;
  default:
    goto LAB_0022c3b1;
  }
  if (pcVar1 != (char *)0x0) {
    return pcVar1;
  }
LAB_0022c3b1:
  return (char *)0x0;
}

Assistant:

[[nodiscard]] const char* FieldParser(uint64_t tag, T& field_parser,
                                      const char* ptr, ParseContext* ctx) {
  uint32_t number = tag >> 3;
  GOOGLE_PROTOBUF_PARSER_ASSERT(number != 0);
  using WireType = internal::WireFormatLite::WireType;
  switch (tag & 7) {
    case WireType::WIRETYPE_VARINT: {
      uint64_t value;
      ptr = VarintParse(ptr, &value);
      GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
      field_parser.AddVarint(number, value);
      break;
    }
    case WireType::WIRETYPE_FIXED64: {
      uint64_t value = UnalignedLoad<uint64_t>(ptr);
      ptr += 8;
      field_parser.AddFixed64(number, value);
      break;
    }
    case WireType::WIRETYPE_LENGTH_DELIMITED: {
      ptr = field_parser.ParseLengthDelimited(number, ptr, ctx);
      GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
      break;
    }
    case WireType::WIRETYPE_START_GROUP: {
      ptr = field_parser.ParseGroup(number, ptr, ctx);
      GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
      break;
    }
    case WireType::WIRETYPE_END_GROUP: {
      ABSL_LOG(FATAL) << "Can't happen";
      break;
    }
    case WireType::WIRETYPE_FIXED32: {
      uint32_t value = UnalignedLoad<uint32_t>(ptr);
      ptr += 4;
      field_parser.AddFixed32(number, value);
      break;
    }
    default:
      return nullptr;
  }
  return ptr;
}